

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O1

uint Ivy_NodeGetTruth_rec(Ivy_Obj_t *pObj,int *pNums,int nNums)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (0 < nNums) {
    lVar3 = 0;
    do {
      if (pObj->Id == *(int *)((long)pNums + lVar3)) {
        return *(uint *)((long)Ivy_NodeGetTruth_rec::uMasks + lVar3);
      }
      lVar3 = lVar3 + 4;
    } while ((ulong)(uint)nNums << 2 != lVar3);
  }
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 5 < 3) {
    uVar1 = Ivy_NodeGetTruth_rec
                      ((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pNums,nNums);
    uVar1 = -(*(uint *)&pObj->pFanin0 & 1) ^ uVar1;
    if ((*(uint *)&pObj->field_0x8 & 0xf) != 7) {
      uVar2 = Ivy_NodeGetTruth_rec
                        ((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pNums,nNums);
      uVar1 = uVar1 & (-(*(uint *)&pObj->pFanin1 & 1) ^ uVar2);
    }
    return uVar1;
  }
  __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyRwr.c"
                ,0x140,"unsigned int Ivy_NodeGetTruth_rec(Ivy_Obj_t *, int *, int)");
}

Assistant:

unsigned Ivy_NodeGetTruth_rec( Ivy_Obj_t * pObj, int * pNums, int nNums )
{
    static unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth0, uTruth1;
    int i;
    for ( i = 0; i < nNums; i++ )
        if ( pObj->Id == pNums[i] )
            return uMasks[i];
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    uTruth0 = Ivy_NodeGetTruth_rec( Ivy_ObjFanin0(pObj), pNums, nNums );
    if ( Ivy_ObjFaninC0(pObj) )
        uTruth0 = ~uTruth0;
    if ( Ivy_ObjIsBuf(pObj) )
        return uTruth0;
    uTruth1 = Ivy_NodeGetTruth_rec( Ivy_ObjFanin1(pObj), pNums, nNums );
    if ( Ivy_ObjFaninC1(pObj) )
        uTruth1 = ~uTruth1;
    return uTruth0 & uTruth1;
}